

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nibbler.cpp
# Opt level: O1

bool __thiscall Nibbler::getUnsignedInt(Nibbler *this,int *result)

{
  ulong uVar1;
  ulong uVar2;
  intmax_t iVar3;
  ulong uVar4;
  ulong uVar5;
  long *local_48 [2];
  long local_38 [2];
  
  uVar1 = this->_length;
  uVar2 = this->_cursor;
  uVar5 = uVar2;
  if (uVar2 < uVar1) {
    uVar4 = uVar2;
    do {
      uVar5 = uVar4;
      if (9 < (int)(this->_input)._M_dataplus._M_p[uVar4] - 0x30U) break;
      uVar4 = uVar4 + 1;
      uVar5 = uVar1;
    } while (uVar1 != uVar4);
  }
  if (uVar2 < uVar5) {
    std::__cxx11::string::substr((ulong)local_48,(ulong)this);
    iVar3 = strtoimax((char *)local_48[0],(char **)0x0,10);
    *result = (int)iVar3;
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
    this->_cursor = uVar5;
  }
  return uVar2 < uVar5;
}

Assistant:

bool Nibbler::getUnsignedInt (int& result)
{
  std::string::size_type i = _cursor;
  // TODO Potential for use of find_first_not_of
  while (i < _length && isdigit (_input[i]))
    ++i;

  if (i > _cursor)
  {
    result = strtoimax (_input.substr (_cursor, i - _cursor).c_str (), NULL, 10);
    _cursor = i;
    return true;
  }

  return false;
}